

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parser.cpp
# Opt level: O1

void franca::error_handler(char *begin,char *end,char *where,info *what)

{
  char *pcVar1;
  ostream *poVar2;
  simple_printer<std::basic_ostream<char,_std::char_traits<char>_>_> pr;
  simple_printer<std::basic_ostream<char,_std::char_traits<char>_>_> local_80;
  long local_78;
  basic_ostream<char,_std::char_traits<char>_> local_70 [16];
  undefined8 local_60;
  undefined1 local_58 [32];
  undefined8 local_38;
  
  local_80.out = (basic_ostream<char,_std::char_traits<char>_> *)begin;
  local_58._0_8_ = where;
  std::__find_if<std::reverse_iterator<char_const*>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
            (&local_38,local_58);
  local_60 = local_38;
  local_58[0] = 10;
  pcVar1 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                     (where,end,local_58);
  if (begin != where) {
    do {
      begin = begin + 1;
    } while (begin != where);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Expecting ",10);
  local_80.out = (basic_ostream<char,_std::char_traits<char>_> *)&std::cout;
  local_58._0_8_ = &local_80;
  local_58._16_4_ = 0;
  local_58._8_8_ = what;
  boost::
  variant<boost::spirit::info::nil_,std::__cxx11::string,boost::recursive_wrapper<boost::spirit::info>,boost::recursive_wrapper<std::pair<boost::spirit::info,boost::spirit::info>>,boost::recursive_wrapper<std::__cxx11::list<boost::spirit::info,std::allocator<boost::spirit::info>>>>
  ::apply_visitor<boost::spirit::basic_info_walker<boost::spirit::simple_printer<std::ostream>>>
            ((variant<boost::spirit::info::nil_,std::__cxx11::string,boost::recursive_wrapper<boost::spirit::info>,boost::recursive_wrapper<std::pair<boost::spirit::info,boost::spirit::info>>,boost::recursive_wrapper<std::__cxx11::list<boost::spirit::info,std::allocator<boost::spirit::info>>>>
              *)&what->value,
             (basic_info_walker<boost::spirit::simple_printer<std::basic_ostream<char,_std::char_traits<char>_>_>_>
              *)local_58);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," in line ",9);
  poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  local_58._0_8_ =
       (simple_printer<std::basic_ostream<char,_std::char_traits<char>_>_> *)(local_58 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,local_60,where);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_58._0_8_,local_58._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[1;31m",7);
  local_80.out = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,where,pcVar1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_80.out,local_78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[0m",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_80.out != local_70) {
    operator_delete(local_80.out);
  }
  if ((simple_printer<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_58._0_8_ !=
      (simple_printer<std::basic_ostream<char,_std::char_traits<char>_>_> *)(local_58 + 0x10)) {
    operator_delete((void *)local_58._0_8_);
  }
  return;
}

Assistant:

void error_handler(const char* begin, const char* end, const char* where,
		boost::spirit::qi::info const& what)
{
	std::reverse_iterator<const char*> rev_end(begin);
	std::reverse_iterator<const char*> rev_where(where);

	auto const line_begin = std::find(rev_where, rev_end, '\n').base();
	auto const line_end = std::find(where, end, '\n');

	auto const line_nr = 1 + std::count(begin, where, '\n');

	std::cout
		<< "Expecting " << what << " in line " << line_nr << std::endl
		<< std::string(line_begin, where)
		<< "\033[1;31m"
		<< std::string(where, line_end)
		<< "\033[0m"
		<< std::endl
		;
}